

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlBuffer.c
# Opt level: O1

JlBuffer * JlBufferCreate(void)

{
  JlBuffer *Memory;
  uint8_t *puVar1;
  
  Memory = (JlBuffer *)WjTestLib_Calloc(0x18,1);
  if (Memory != (JlBuffer *)0x0) {
    puVar1 = (uint8_t *)WjTestLib_Calloc(0x4000,1);
    Memory->Buffer = puVar1;
    if (puVar1 != (uint8_t *)0x0) {
      Memory->BufferAllocated = 0x4000;
      Memory->BufferUsed = 0;
      return Memory;
    }
    WjTestLib_Free(Memory);
  }
  return (JlBuffer *)0x0;
}

Assistant:

JlBuffer*
    JlBufferCreate
    (
        void
    )
{
    JlBuffer* newBuffer = JlNew( JlBuffer );
    if( NULL != newBuffer )
    {
        newBuffer->Buffer = JlAlloc( BUFFER_GROW_SIZE );
        if( NULL != newBuffer->Buffer )
        {
            newBuffer->BufferAllocated = BUFFER_GROW_SIZE;
            newBuffer->BufferUsed = 0;
        }
        else
        {
            JlFree( newBuffer );
            newBuffer = NULL;
        }
    }
    else
    {
        // Failed to allocate
    }

    return newBuffer;
}